

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::pls_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,PlsRemap *var)

{
  uint uVar1;
  SPIRVariable *pSVar2;
  Bitset *pBVar3;
  undefined8 uVar4;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  char *local_1a0 [2];
  char local_190 [16];
  undefined **local_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  undefined1 *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 local_148 [32];
  undefined1 *local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  undefined1 local_104;
  undefined1 local_103;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [32];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [32];
  undefined7 local_88;
  undefined4 uStack_81;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar2 = Variant::get<spirv_cross::SPIRVariable>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      var->id);
  uVar1 = var->format - PlsRGBA8I;
  if (uVar1 < 6) {
    uVar4 = *(undefined8 *)(&DAT_00305e38 + (ulong)uVar1 * 8);
  }
  else {
    uVar4 = 0xd00000016;
  }
  local_178 = 0;
  local_180 = &PTR__SPIRType_003a2fa8;
  local_174 = (undefined4)uVar4;
  local_16c = 0;
  local_168 = 1;
  local_164 = 1;
  local_158 = 0;
  local_150 = 8;
  local_120 = 0;
  local_118 = 8;
  local_108 = 0;
  local_104 = 0;
  local_103 = 0;
  local_100 = 8;
  local_f0 = 0;
  local_e8 = 8;
  local_b8 = 0;
  local_b0 = 8;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_88 = 0;
  uStack_81 = 0;
  local_7c = 0;
  uStack_74 = 0;
  local_6c = 0;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_170 = (undefined4)((ulong)uVar4 >> 0x20);
  uVar1 = var->format - PlsR11FG11FB10F;
  if ((uVar1 < 0xb) && ((0x7fdU >> (uVar1 & 0x1f) & 1) != 0)) {
    local_168 = *(undefined4 *)(&DAT_00305e68 + (ulong)uVar1 * 4);
    local_174 = 0x17;
  }
  if (uVar1 < 0xc) {
    local_1c8 = &DAT_00305e94 + *(int *)(&DAT_00305e94 + (ulong)uVar1 * 4);
  }
  else {
    local_1c8 = "";
  }
  local_160 = local_148;
  local_128 = local_110;
  local_f8 = local_e0;
  local_c0 = local_a8;
  pBVar3 = Compiler::get_decoration_bitset
                     (&this->super_Compiler,(ID)(pSVar2->super_IVariant).self.id);
  local_1d0 = "mediump ";
  if ((pBVar3->lower & 1) == 0) {
    local_1d0 = "highp ";
  }
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1a0,this,&local_180,0);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (local_1c0,this,(ulong)(pSVar2->super_IVariant).self.id,1);
  join<char_const*,char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&local_1c8,&local_1d0,local_1a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f14f1,
             (char (*) [2])local_1c0,__return_storage_ptr__);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  local_180 = &PTR__SPIRType_003a2fa8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_f0 = 0;
  if (local_f8 != local_e0) {
    free(local_f8);
  }
  local_120 = 0;
  if (local_128 != local_110) {
    free(local_128);
  }
  local_158 = 0;
  if (local_160 != local_148) {
    free(local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::pls_decl(const PlsRemap &var)
{
	auto &variable = get<SPIRVariable>(var.id);

	auto op_and_basetype = pls_format_to_basetype(var.format);

	SPIRType type { op_and_basetype.first };
	type.basetype = op_and_basetype.second;
	auto vecsize = pls_format_to_components(var.format);
	if (vecsize > 1)
	{
		type.op = OpTypeVector;
		type.vecsize = vecsize;
	}

	return join(to_pls_layout(var.format), to_pls_qualifiers_glsl(variable), type_to_glsl(type), " ",
	            to_name(variable.self));
}